

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

PosixWritableFile * __thiscall
leveldb::anon_unknown_1::PosixWritableFile::Dirname(PosixWritableFile *this,string *filename)

{
  long lVar1;
  allocator local_21;
  long local_20;
  size_type separator_pos;
  string *filename_local;
  
  separator_pos = (size_type)filename;
  filename_local = (string *)this;
  local_20 = std::__cxx11::string::rfind((char)filename,0x2f);
  if (local_20 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,".",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    lVar1 = std::__cxx11::string::find((char)separator_pos,0x2f);
    if (lVar1 != -1) {
      __assert_fail("filename.find(\'/\', separator_pos + 1) == std::string::npos",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_posix.cc"
                    ,0x192,
                    "static std::string leveldb::(anonymous namespace)::PosixWritableFile::Dirname(const std::string &)"
                   );
    }
    std::__cxx11::string::substr((ulong)this,separator_pos);
  }
  return this;
}

Assistant:

static std::string Dirname(const std::string& filename) {
    std::string::size_type separator_pos = filename.rfind('/');
    if (separator_pos == std::string::npos) {
      return std::string(".");
    }
    // The filename component should not contain a path separator. If it does,
    // the splitting was done incorrectly.
    assert(filename.find('/', separator_pos + 1) == std::string::npos);

    return filename.substr(0, separator_pos);
  }